

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Glucose::SimpSolver::cleanUpClauses(SimpSolver *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::cleanAll
            (&this->occurs);
  iVar4 = (this->super_Solver).clauses.sz;
  if (0 < iVar4) {
    puVar2 = (this->super_Solver).clauses.data;
    puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    lVar6 = 0;
    iVar7 = 0;
    do {
      uVar1 = puVar2[lVar6];
      if ((puVar3[uVar1] & 3) == 0) {
        lVar5 = (long)iVar7;
        iVar7 = iVar7 + 1;
        puVar2[lVar5] = uVar1;
        iVar4 = (this->super_Solver).clauses.sz;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
    if (0 < (int)lVar6 - iVar7) {
      (this->super_Solver).clauses.sz = (iVar4 + iVar7) - (int)lVar6;
    }
  }
  return;
}

Assistant:

void SimpSolver::cleanUpClauses()
{
    occurs.cleanAll();
    int i,j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() == 0)
            clauses[j++] = clauses[i];
    clauses.shrink(i - j);
}